

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stl_encoder.cc
# Opt level: O3

Status * __thiscall
draco::StlEncoder::EncodeInternal(Status *__return_storage_ptr__,StlEncoder *this)

{
  float fVar1;
  __uniq_ptr_impl<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_> _Var2;
  size_t __n;
  EncoderBuffer *pEVar3;
  int i;
  uint uVar4;
  IndexType<unsigned_int,_draco::PointIndex_tag_type_> IVar5;
  Mesh *pMVar6;
  long lVar7;
  ulong uVar8;
  ulong uVar9;
  pointer paVar10;
  IndexType<unsigned_int,_draco::PointIndex_tag_type_> *pIVar11;
  long lVar12;
  long lVar13;
  Scalar ret_2;
  float fVar14;
  uint16_t unused;
  uint32_t num_faces;
  Vector3f pos [3];
  VectorD<float,_3> r;
  Self ret_1;
  Self ret;
  string header_str;
  stringstream out;
  undefined2 local_26e;
  int local_26c;
  long *local_268;
  undefined8 uStack_260;
  long local_258;
  float afStack_250 [6];
  Mesh **local_238;
  undefined8 local_230;
  float local_228;
  undefined1 local_224 [4];
  long local_220;
  float local_218 [4];
  float local_208 [4];
  Status *local_1f8;
  ulong local_1f0;
  ulong local_1e8;
  long local_1e0;
  long *local_1d8;
  long local_1c8 [2];
  stringstream local_1b8 [16];
  long local_1a8 [2];
  undefined8 uStack_198;
  uint auStack_190 [22];
  ios_base local_138 [264];
  
  std::__cxx11::stringstream::stringstream(local_1b8);
  *(uint *)((long)auStack_190 + *(long *)(local_1a8[0] + -0x18)) =
       *(uint *)((long)auStack_190 + *(long *)(local_1a8[0] + -0x18)) & 0xffffff4f | 0x20;
  *(undefined8 *)((long)&uStack_198 + *(long *)(local_1a8[0] + -0x18)) = 0x50;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"generated using Draco",0x15);
  std::__cxx11::stringbuf::str();
  if (this->out_buffer_->bit_encoder_reserved_bytes_ < 1) {
    std::vector<char,std::allocator<char>>::_M_range_insert<unsigned_char_const*>();
    pEVar3 = this->out_buffer_;
    local_238 = &this->in_mesh_;
    pMVar6 = this->in_mesh_;
    local_26c = (int)((ulong)((long)(pMVar6->faces_).vector_.
                                    super__Vector_base<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>,_std::allocator<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                             (long)(pMVar6->faces_).vector_.
                                   super__Vector_base<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>,_std::allocator<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start) >> 2) * -0x55555555;
    if (pEVar3->bit_encoder_reserved_bytes_ < 1) {
      std::vector<char,std::allocator<char>>::_M_range_insert<unsigned_char_const*>
                ((vector<char,std::allocator<char>> *)pEVar3,
                 (pEVar3->buffer_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_finish,&local_26c,&local_268);
      pMVar6 = *local_238;
    }
  }
  else {
    pMVar6 = this->in_mesh_;
    local_238 = &this->in_mesh_;
    local_26c = (int)((ulong)((long)(pMVar6->faces_).vector_.
                                    super__Vector_base<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>,_std::allocator<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                             (long)(pMVar6->faces_).vector_.
                                   super__Vector_base<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>,_std::allocator<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start) >> 2) * -0x55555555;
  }
  uVar4 = PointCloud::GetNamedAttributeId(&pMVar6->super_PointCloud,POSITION);
  if ((int)uVar4 < 0) {
    local_268 = &local_258;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_268,"Mesh is missing the position attribute.","");
    __return_storage_ptr__->code_ = DRACO_ERROR;
    (__return_storage_ptr__->error_msg_)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->error_msg_).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&__return_storage_ptr__->error_msg_,local_268,uStack_260 + (long)local_268)
    ;
  }
  else {
    pMVar6 = *local_238;
    local_1f0 = (ulong)uVar4;
    if (*(int *)((long)(pMVar6->super_PointCloud).attributes_.
                       super__Vector_base<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>,_std::allocator<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[local_1f0]._M_t.
                       super___uniq_ptr_impl<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>
                       ._M_t + 0x1c) == 9) {
      local_26e = 0;
      paVar10 = (pMVar6->faces_).vector_.
                super__Vector_base<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>,_std::allocator<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      local_1f8 = __return_storage_ptr__;
      if ((int)((ulong)((long)(pMVar6->faces_).vector_.
                              super__Vector_base<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>,_std::allocator<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)paVar10) >> 2) *
          -0x55555555 != 0) {
        lVar12 = 0;
        uVar8 = 0;
        do {
          _Var2._M_t.
          super__Tuple_impl<0UL,_draco::PointAttribute_*,_std::default_delete<draco::PointAttribute>_>
          .super__Head_base<0UL,_draco::PointAttribute_*,_false>._M_head_impl =
               (pMVar6->super_PointCloud).attributes_.
               super__Vector_base<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>,_std::allocator<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start[local_1f0]._M_t.
               super___uniq_ptr_impl<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>
               ._M_t;
          local_258 = 0;
          afStack_250[0] = 0.0;
          afStack_250[1] = 0.0;
          local_268 = (long *)0x0;
          uStack_260 = 0;
          afStack_250[2] = 0.0;
          IVar5.value_ = paVar10[uVar8]._M_elems[0].value_;
          local_220 = CONCAT71(local_220._1_7_,
                               *(char *)((long)_Var2._M_t.
                                               super__Tuple_impl<0UL,_draco::PointAttribute_*,_std::default_delete<draco::PointAttribute>_>
                                               .
                                               super__Head_base<0UL,_draco::PointAttribute_*,_false>
                                               ._M_head_impl + 100));
          if (*(char *)((long)_Var2._M_t.
                              super__Tuple_impl<0UL,_draco::PointAttribute_*,_std::default_delete<draco::PointAttribute>_>
                              .super__Head_base<0UL,_draco::PointAttribute_*,_false>._M_head_impl +
                       100) == '\0') {
            IVar5.value_ = *(uint *)(*(long *)((long)_Var2._M_t.
                                                                                                          
                                                  super__Tuple_impl<0UL,_draco::PointAttribute_*,_std::default_delete<draco::PointAttribute>_>
                                                  .
                                                  super__Head_base<0UL,_draco::PointAttribute_*,_false>
                                                  ._M_head_impl + 0x48) + (ulong)IVar5.value_ * 4);
          }
          __n = *(size_t *)
                 ((long)_Var2._M_t.
                        super__Tuple_impl<0UL,_draco::PointAttribute_*,_std::default_delete<draco::PointAttribute>_>
                        .super__Head_base<0UL,_draco::PointAttribute_*,_false>._M_head_impl + 0x28);
          lVar13 = **(long **)_Var2._M_t.
                              super__Tuple_impl<0UL,_draco::PointAttribute_*,_std::default_delete<draco::PointAttribute>_>
                              .super__Head_base<0UL,_draco::PointAttribute_*,_false>._M_head_impl +
                   *(long *)((long)_Var2._M_t.
                                   super__Tuple_impl<0UL,_draco::PointAttribute_*,_std::default_delete<draco::PointAttribute>_>
                                   .super__Head_base<0UL,_draco::PointAttribute_*,_false>.
                                   _M_head_impl + 0x30);
          local_1e8 = uVar8;
          local_1e0 = lVar12;
          memcpy(&local_268,(void *)(IVar5.value_ * __n + lVar13),__n);
          uVar9 = (ulong)paVar10[uVar8]._M_elems[1].value_;
          if ((char)local_220 == '\0') {
            local_220 = *(long *)((long)_Var2._M_t.
                                        super__Tuple_impl<0UL,_draco::PointAttribute_*,_std::default_delete<draco::PointAttribute>_>
                                        .super__Head_base<0UL,_draco::PointAttribute_*,_false>.
                                        _M_head_impl + 0x48);
            memcpy((void *)((long)&uStack_260 + 4),
                   (void *)(*(uint *)(local_220 + uVar9 * 4) * __n + lVar13),__n);
            pIVar11 = (IndexType<unsigned_int,_draco::PointIndex_tag_type_> *)
                      (local_220 + (ulong)paVar10[uVar8]._M_elems[2].value_ * 4);
          }
          else {
            memcpy((void *)((long)&uStack_260 + 4),(void *)(uVar9 * __n + lVar13),__n);
            pIVar11 = paVar10[uVar8]._M_elems + 2;
          }
          memcpy(afStack_250,(void *)(lVar13 + pIVar11->value_ * __n),__n);
          lVar12 = local_1e0;
          local_208[2] = 0.0;
          local_208[0] = 0.0;
          local_208[1] = 0.0;
          lVar13 = 0;
          do {
            local_208[lVar13] =
                 *(float *)((long)&uStack_260 + lVar13 * 4 + 4) -
                 *(float *)((long)&local_268 + lVar13 * 4);
            lVar13 = lVar13 + 1;
          } while (lVar13 != 3);
          local_218[2] = 0.0;
          local_218[0] = 0.0;
          local_218[1] = 0.0;
          lVar13 = 0;
          do {
            local_218[lVar13] = afStack_250[lVar13] - *(float *)((long)&local_268 + lVar13 * 4);
            lVar13 = lVar13 + 1;
          } while (lVar13 != 3);
          local_230 = CONCAT44(local_218[0] * local_208[2] - local_208[0] * local_218[2],
                               local_218[2] * local_208[1] - local_208[2] * local_218[1]);
          local_228 = local_208[0] * local_218[1] - local_218[0] * local_208[1];
          fVar14 = 0.0;
          lVar13 = 0;
          do {
            fVar1 = *(float *)((long)&local_230 + lVar13 * 4);
            fVar14 = fVar14 + fVar1 * fVar1;
            lVar13 = lVar13 + 1;
          } while (lVar13 != 3);
          if (fVar14 < 0.0) {
            fVar14 = sqrtf(fVar14);
          }
          else {
            fVar14 = SQRT(fVar14);
          }
          if ((fVar14 != 0.0) || (NAN(fVar14))) {
            lVar13 = 0;
            do {
              *(float *)((long)&local_230 + lVar13 * 4) =
                   *(float *)((long)&local_230 + lVar13 * 4) / fVar14;
              lVar13 = lVar13 + 1;
            } while (lVar13 != 3);
          }
          pEVar3 = this->out_buffer_;
          if (pEVar3->bit_encoder_reserved_bytes_ < 1) {
            std::vector<char,std::allocator<char>>::_M_range_insert<unsigned_char_const*>
                      ((vector<char,std::allocator<char>> *)pEVar3,
                       (pEVar3->buffer_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                       super__Vector_impl_data._M_finish,&local_230,local_224);
          }
          lVar13 = 0;
          do {
            uVar4 = *(uint *)((long)(paVar10->_M_elems + lVar13) + lVar12);
            if (*(char *)((long)_Var2._M_t.
                                super__Tuple_impl<0UL,_draco::PointAttribute_*,_std::default_delete<draco::PointAttribute>_>
                                .super__Head_base<0UL,_draco::PointAttribute_*,_false>._M_head_impl
                         + 100) == '\0') {
              uVar4 = *(uint *)(*(long *)((long)_Var2._M_t.
                                                super__Tuple_impl<0UL,_draco::PointAttribute_*,_std::default_delete<draco::PointAttribute>_>
                                                .
                                                super__Head_base<0UL,_draco::PointAttribute_*,_false>
                                                ._M_head_impl + 0x48) + (ulong)uVar4 * 4);
            }
            pEVar3 = this->out_buffer_;
            if (pEVar3->bit_encoder_reserved_bytes_ < 1) {
              lVar7 = (ulong)uVar4 *
                      *(long *)((long)_Var2._M_t.
                                      super__Tuple_impl<0UL,_draco::PointAttribute_*,_std::default_delete<draco::PointAttribute>_>
                                      .super__Head_base<0UL,_draco::PointAttribute_*,_false>.
                                      _M_head_impl + 0x28) +
                      **(long **)_Var2._M_t.
                                 super__Tuple_impl<0UL,_draco::PointAttribute_*,_std::default_delete<draco::PointAttribute>_>
                                 .super__Head_base<0UL,_draco::PointAttribute_*,_false>._M_head_impl
                      + *(long *)((long)_Var2._M_t.
                                        super__Tuple_impl<0UL,_draco::PointAttribute_*,_std::default_delete<draco::PointAttribute>_>
                                        .super__Head_base<0UL,_draco::PointAttribute_*,_false>.
                                        _M_head_impl + 0x30);
              std::vector<char,std::allocator<char>>::_M_range_insert<unsigned_char_const*>
                        ((vector<char,std::allocator<char>> *)pEVar3,
                         (pEVar3->buffer_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                         super__Vector_impl_data._M_finish,lVar7,
                         *(long *)((long)_Var2._M_t.
                                         super__Tuple_impl<0UL,_draco::PointAttribute_*,_std::default_delete<draco::PointAttribute>_>
                                         .super__Head_base<0UL,_draco::PointAttribute_*,_false>.
                                         _M_head_impl + 0x28) + lVar7);
            }
            lVar13 = lVar13 + 1;
          } while (lVar13 != 3);
          pEVar3 = this->out_buffer_;
          if (pEVar3->bit_encoder_reserved_bytes_ < 1) {
            std::vector<char,std::allocator<char>>::_M_range_insert<unsigned_char_const*>
                      ((vector<char,std::allocator<char>> *)pEVar3,
                       (pEVar3->buffer_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                       super__Vector_impl_data._M_finish,&local_26e,&local_26c);
          }
          uVar8 = local_1e8 + 1;
          pMVar6 = *local_238;
          paVar10 = (pMVar6->faces_).vector_.
                    super__Vector_base<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>,_std::allocator<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          lVar12 = lVar12 + 0xc;
        } while (uVar8 < (uint)((int)((ulong)((long)(pMVar6->faces_).vector_.
                                                                                                        
                                                  super__Vector_base<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>,_std::allocator<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                             (long)paVar10) >> 2) * -0x55555555));
      }
      local_1f8->code_ = OK;
      (local_1f8->error_msg_)._M_dataplus._M_p = (pointer)&(local_1f8->error_msg_).field_2;
      (local_1f8->error_msg_)._M_string_length = 0;
      (local_1f8->error_msg_).field_2._M_local_buf[0] = '\0';
      __return_storage_ptr__ = local_1f8;
      goto LAB_0012193f;
    }
    local_268 = &local_258;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_268,"Mesh position attribute is not of type float32.","");
    __return_storage_ptr__->code_ = DRACO_ERROR;
    (__return_storage_ptr__->error_msg_)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->error_msg_).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&__return_storage_ptr__->error_msg_,local_268,uStack_260 + (long)local_268)
    ;
  }
  if (local_268 != &local_258) {
    operator_delete(local_268,local_258 + 1);
  }
LAB_0012193f:
  if (local_1d8 != local_1c8) {
    operator_delete(local_1d8,local_1c8[0] + 1);
  }
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base(local_138);
  return __return_storage_ptr__;
}

Assistant:

Status StlEncoder::EncodeInternal() {
  // Write STL header.
  std::stringstream out;
  out << std::left << std::setw(80)
      << "generated using Draco";  // header is 80 bytes fixed size.
  const std::string header_str = out.str();
  buffer()->Encode(header_str.data(), header_str.length());

  uint32_t num_faces = in_mesh_->num_faces();
  buffer()->Encode(&num_faces, 4);

  std::vector<uint8_t> stl_face;

  const int pos_att_id =
      in_mesh_->GetNamedAttributeId(GeometryAttribute::POSITION);

  if (pos_att_id < 0) {
    return ErrorStatus("Mesh is missing the position attribute.");
  }

  if (in_mesh_->attribute(pos_att_id)->data_type() != DT_FLOAT32) {
    return ErrorStatus("Mesh position attribute is not of type float32.");
  }

  uint16_t unused = 0;

  if (in_mesh_) {
    for (FaceIndex i(0); i < in_mesh_->num_faces(); ++i) {
      const auto &f = in_mesh_->face(i);
      const auto *const pos_att = in_mesh_->attribute(pos_att_id);

      // The normal attribute can contain arbitrary normals that may not
      // correspond to the winding of the face.
      // Therefor we simply always calculate them
      // using the points of the triangle face: norm(cross(p2-p1, p3-p1))

      Vector3f pos[3];
      pos_att->GetMappedValue(f[0], &pos[0][0]);
      pos_att->GetMappedValue(f[1], &pos[1][0]);
      pos_att->GetMappedValue(f[2], &pos[2][0]);
      Vector3f norm = CrossProduct(pos[1] - pos[0], pos[2] - pos[0]);
      norm.Normalize();
      buffer()->Encode(norm.data(), sizeof(float) * 3);

      for (int c = 0; c < 3; ++c) {
        buffer()->Encode(pos_att->GetAddress(pos_att->mapped_index(f[c])),
                         pos_att->byte_stride());
      }

      buffer()->Encode(&unused, 2);
    }
  }
  return OkStatus();
}